

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimate_halfway.cc
# Opt level: O1

int main(void)

{
  double *pdVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  sample *psVar5;
  int iVar6;
  sample *psVar7;
  long lVar8;
  ostream *poVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  sample *psVar14;
  sample *psVar15;
  size_t __n;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  sample samples [10000];
  double dStack_27158;
  double dStack_27150;
  double adStack_27148 [2];
  sample sStack_27138;
  sample asStack_27128 [14];
  double adStack_27048 [19971];
  
  lVar12 = 8;
  dVar18 = 0.0;
  do {
    iVar6 = rand();
    dVar19 = (double)iVar6 * 4.656612873077393e-10 * 6.283185307179586 + 0.0;
    adStack_27148[1] = sin(dVar19);
    dVar4 = exp(dVar19 / -6.283185307179586);
    dVar4 = dVar4 * adStack_27148[1] * adStack_27148[1];
    dVar18 = dVar18 + dVar4;
    *(double *)((long)adStack_27148 + lVar12 + 8) = dVar19;
    *(double *)((long)&sStack_27138.x + lVar12) = dVar4;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x27108);
  std::
  __introsort_loop<sample*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(sample_const&,sample_const&)>>
            (&sStack_27138,(sample *)(adStack_27048 + 0x4e02),0x1a,
             (_Iter_comp_iter<bool_(*)(const_sample_&,_const_sample_&)>)0x1014b6);
  __n = 0x10;
  psVar7 = &sStack_27138;
  psVar14 = asStack_27128;
  do {
    psVar15 = (sample *)((long)&sStack_27138.x + __n);
    dVar19 = psVar15->x;
    if (sStack_27138.x <= dVar19) {
      dVar4 = *(double *)((long)asStack_27128 + (__n - 8));
      dVar2 = psVar7->x;
      psVar7 = psVar15;
      psVar5 = psVar14;
      while (dVar19 < dVar2) {
        psVar7 = psVar5 + -1;
        dVar2 = psVar5[-1].p_x;
        psVar5->x = psVar5[-1].x;
        psVar5->p_x = dVar2;
        dVar2 = psVar5[-2].x;
        psVar5 = psVar7;
      }
      psVar7->x = dVar19;
      psVar7->p_x = dVar4;
    }
    else {
      dStack_27158 = psVar15->x;
      dStack_27150 = *(double *)((long)asStack_27128 + (__n - 8));
      memmove(asStack_27128,&sStack_27138,__n);
      sStack_27138.x = dStack_27158;
      sStack_27138.p_x = dStack_27150;
    }
    lVar12 = std::cout;
    __n = __n + 0x10;
    psVar14 = psVar14 + 1;
    psVar7 = psVar15;
  } while (__n != 0x100);
  lVar8 = 0x100;
  pdVar10 = adStack_27048;
  do {
    pdVar10 = pdVar10 + 2;
    dVar19 = *(double *)((long)&sStack_27138.x + lVar8);
    dVar4 = *(double *)((long)asStack_27128 + lVar8 + -8);
    pdVar13 = pdVar10;
    if (*(double *)((long)adStack_27148 + lVar8) <= dVar19) {
      pdVar11 = (double *)((long)&sStack_27138.x + lVar8);
    }
    else {
      do {
        pdVar11 = pdVar13 + -2;
        *pdVar13 = pdVar13[-2];
        pdVar13[1] = pdVar13[-1];
        pdVar1 = pdVar13 + -4;
        pdVar13 = pdVar11;
      } while (dVar19 < *pdVar1);
    }
    *pdVar11 = dVar19;
    pdVar11[1] = dVar4;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 160000);
  dVar19 = 0.0;
  lVar8 = 8;
  do {
    dVar19 = dVar19 + *(double *)((long)&sStack_27138.x + lVar8);
    if (dVar18 * 0.5 <= dVar19) {
      uVar3 = *(undefined8 *)((long)adStack_27148 + lVar8 + 8);
      uVar16 = (undefined4)uVar3;
      uVar17 = (undefined4)((ulong)uVar3 >> 0x20);
      goto LAB_001016c8;
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x27108);
  uVar16 = 0;
  uVar17 = 0;
LAB_001016c8:
  *(uint *)(memmove + *(long *)(std::cout + -0x18)) =
       *(uint *)(memmove + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar12 + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Average = ",10);
  poVar9 = std::ostream::_M_insert<double>(dVar18 / 10000.0);
  dStack_27158._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&dStack_27158,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Area under curve = ",0x13);
  poVar9 = std::ostream::_M_insert<double>((dVar18 * 6.283185307179586) / 10000.0);
  dStack_27158._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&dStack_27158,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Halfway = ",10);
  poVar9 = std::ostream::_M_insert<double>((double)CONCAT44(uVar17,uVar16));
  dStack_27158 = (double)CONCAT71(dStack_27158._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&dStack_27158,1);
  return 0;
}

Assistant:

int main() {
    const unsigned int N = 10000;
    sample samples[N];
    double sum = 0.0;

    // Iterate through all of our samples.

    for (unsigned int i = 0; i < N; i++) {
        // Get the area under the curve.
        auto x = random_double(0, 2*pi);
        auto sin_x = std::sin(x);
        auto p_x = exp(-x / (2*pi)) * sin_x * sin_x;
        sum += p_x;

        // Store this sample.
        sample this_sample = {x, p_x};
        samples[i] = this_sample;
    }

    // Sort the samples by x.
    std::sort(std::begin(samples), std::end(samples), compare_by_x);

    // Find out the sample at which we have half of our area.
    double half_sum = sum / 2.0;
    double halfway_point = 0.0;
    double accum = 0.0;
    for (unsigned int i = 0; i < N; i++){
        accum += samples[i].p_x;
        if (accum >= half_sum) {
            halfway_point = samples[i].x;
            break;
        }
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "Average = " << sum / N << '\n';
    std::cout << "Area under curve = " << 2 * pi * sum / N << '\n';
    std::cout << "Halfway = " << halfway_point << '\n';
}